

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragIntRange2
               (char *label,int *v_current_min,int *v_current_max,float v_speed,int v_min,int v_max,
               char *format,char *format_max)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  char *text_end;
  float w_full;
  int local_50;
  int local_4c;
  char *local_48;
  int *local_40;
  char *local_38;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    local_48 = format;
    local_40 = v_current_max;
    local_38 = label;
    PushID(label);
    BeginGroup();
    w_full = CalcItemWidth();
    PushMultiItemsWidths(2,w_full);
    pcVar4 = local_48;
    iVar1 = *v_current_max;
    local_50 = iVar1;
    if (v_max < iVar1) {
      local_50 = v_max;
    }
    local_4c = v_min;
    if (v_max <= v_min) {
      local_50 = iVar1;
      local_4c = -0x80000000;
    }
    bVar5 = DragScalar("##min",4,v_current_min,v_speed,&local_4c,&local_50,local_48,1.0);
    PopItemWidth();
    SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
    iVar1 = *v_current_min;
    local_4c = iVar1;
    if (iVar1 < v_min) {
      local_4c = v_min;
    }
    if (v_max <= v_min) {
      local_4c = iVar1;
      v_max = 0x7fffffff;
    }
    if (format_max == (char *)0x0) {
      format_max = pcVar4;
    }
    local_50 = v_max;
    bVar6 = DragScalar("##max",4,local_40,v_speed,&local_4c,&local_50,format_max,1.0);
    bVar6 = bVar6 || bVar5;
    PopItemWidth();
    SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
    pcVar4 = local_38;
    text_end = FindRenderedTextEnd(local_38,(char *)0x0);
    TextEx(pcVar4,text_end,0);
    EndGroup();
    PopID();
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ImGui::DragFloat2(const char* label, float v[2], float v_speed, float v_min, float v_max, const char* format, float power)
{
    return DragScalarN(label, ImGuiDataType_Float, v, 2, v_speed, &v_min, &v_max, format, power);
}